

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

void __thiscall
OpenMesh::PolyConnectivity::delete_vertex
          (PolyConnectivity *this,VertexHandle _vh,bool _delete_isolated_vertices)

{
  bool bVar1;
  reference pFVar2;
  StatusInfo *this_00;
  __normal_iterator<OpenMesh::FaceHandle_*,_std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
  local_78;
  iterator fh_end;
  iterator fh_it;
  undefined1 local_60 [8];
  VFIter vf_it;
  undefined1 local_38 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_handles;
  bool _delete_isolated_vertices_local;
  PolyConnectivity *this_local;
  VertexHandle _vh_local;
  
  face_handles.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = _delete_isolated_vertices;
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
            ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_38);
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::reserve
            ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_38,8);
  fh_it._M_current._4_4_ = _vh.super_BaseHandle.idx_;
  vf_iter((VertexFaceIter *)local_60,this,_vh);
  while( true ) {
    bVar1 = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
            ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                        *)local_60);
    if (!bVar1) break;
    fh_it._M_current._0_4_ =
         (int)Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                           *)local_60);
    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::push_back
              ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_38,
               (value_type *)&fh_it);
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                  *)local_60);
  }
  fh_end = std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::begin
                     ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                      local_38);
  local_78._M_current =
       (FaceHandle *)
       std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::end
                 ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&fh_end,&local_78);
    if (!bVar1) break;
    pFVar2 = __gnu_cxx::
             __normal_iterator<OpenMesh::FaceHandle_*,_std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
             ::operator*(&fh_end);
    delete_face(this,(FaceHandle)(pFVar2->super_BaseHandle).idx_,
                (bool)(face_handles.
                       super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    __gnu_cxx::
    __normal_iterator<OpenMesh::FaceHandle_*,_std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
    ::operator++(&fh_end);
  }
  this_00 = ArrayKernel::status(&this->super_ArrayKernel,_vh);
  Attributes::StatusInfo::set_deleted(this_00,true);
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~vector
            ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_38);
  return;
}

Assistant:

void PolyConnectivity::delete_vertex(VertexHandle _vh, bool _delete_isolated_vertices)
{
  // store incident faces
  std::vector<FaceHandle> face_handles;
  face_handles.reserve(8);
  for (VFIter vf_it(vf_iter(_vh)); vf_it.is_valid(); ++vf_it)
    face_handles.push_back(*vf_it);


  // delete collected faces
  std::vector<FaceHandle>::iterator fh_it(face_handles.begin()),
                                    fh_end(face_handles.end());

  for (; fh_it!=fh_end; ++fh_it)
    delete_face(*fh_it, _delete_isolated_vertices);

  status(_vh).set_deleted(true);
}